

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNCommaBase::fold_binop(CTPNCommaBase *this)

{
  CTcPrsNode *pCVar1;
  
  pCVar1 = CTcPrsOpComma::eval_constant
                     ((CTcPrsOpComma *)this,(this->super_CTPNBin).super_CTPNBinBase.left_,
                      (this->super_CTPNBin).super_CTPNBinBase.right_);
  return pCVar1;
}

Assistant:

CTcPrsNode *CTPNCommaBase::fold_binop()
{
    /* use the normal addition folder */
    return S_op_comma.eval_constant(left_, right_);
}